

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

Var __thiscall
Js::SourceTextModuleRecord::PostProcessDynamicModuleImport(SourceTextModuleRecord *this)

{
  void *count;
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Data DVar5;
  undefined4 *puVar6;
  JavascriptPromise *pJVar7;
  char16 *pcVar8;
  Var pvVar9;
  size_t count_00;
  Recycler *this_00;
  char16_t *dest;
  JavascriptError *pError;
  void *__frameAddr;
  undefined1 local_68 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  scriptContext = (this->scriptContext).ptr;
  pJVar7 = (this->promise).ptr;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x12f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (pJVar7 == (JavascriptPromise *)0x0) {
    pJVar7 = JavascriptPromise::CreateEnginePromise(scriptContext);
    Memory::WriteBarrierPtr<Js::JavascriptPromise>::WriteBarrierSet(&this->promise,pJVar7);
  }
  if ((this->parentsNotified == true) && (this->wasDeclarationInitialized == false)) {
    iVar4 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[10])(this);
    if ((char)iVar4 != '\0') {
      (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0xb])(this);
    }
    if ((this->errorObject).ptr == (void *)0x0) {
      if ((this->hadNotifyHostReady == false) &&
         ((this->super_ModuleRecordBase).wasEvaluated == false)) {
        pcVar8 = GetSpecifierSz(this);
        Output::TraceWithFlush
                  (ModulePhase,
                   L"\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n",pcVar8);
        if (scriptContext->threadContext->isScriptActive == true) {
          LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_68,scriptContext,
                     &stack0xfffffffffffffff8);
          pTVar1 = scriptContext->threadContext;
          bVar3 = pTVar1->reentrancySafeOrHandled;
          pTVar1->reentrancySafeOrHandled = true;
          iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
          pTVar1->reentrancySafeOrHandled = bVar3;
          LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_68);
        }
        else {
          DVar5 = ExceptionCheck::Save();
          local_68._0_4_ = DVar5.handledExceptionType;
          iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ExceptionCheck::Restore((Data *)local_68);
        }
        this->hadNotifyHostReady = true;
        if (iVar4 < 0) {
          ReleaseParserResourcesForHierarchy(this);
          pcVar8 = GetSpecifierSz(this);
          count_00 = PAL_wcslen(pcVar8);
          count = (void *)(count_00 + 1);
          local_68 = (undefined1  [8])&char16_t::typeinfo;
          __leaveScriptObject.scriptContext = (ScriptContext *)0x0;
          __leaveScriptObject._16_8_ = anon_var_dwarf_586c2f7;
          __leaveScriptObject.savedFPUControl.m_oldFpuControl = 0x15d;
          __leaveScriptObject.frameAddress = count;
          this_00 = Memory::Recycler::TrackAllocInfo
                              (scriptContext->recycler,(TrackAllocData *)local_68);
          dest = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (size_t)count);
          __leaveScriptObject._36_4_ = iVar4;
          wmemcpy_s(dest,(size_t)count,pcVar8,count_00);
          dest[count_00] = L'\0';
          pError = JavascriptLibrary::CreateURIError
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          JavascriptError::SetErrorMessageProperties
                    (pError,__leaveScriptObject._36_4_,dest,scriptContext);
          pvVar9 = ResolveOrRejectDynamicImportPromise(false,pError,scriptContext,this,true);
          return pvVar9;
        }
      }
    }
    else {
      ReleaseParserResourcesForHierarchy(this);
      ResolveOrRejectDynamicImportPromise(false,(this->errorObject).ptr,scriptContext,this,false);
    }
  }
  pvVar9 = JavascriptPromise::CreatePassThroughPromise((this->promise).ptr,scriptContext);
  return pvVar9;
}

Assistant:

Var SourceTextModuleRecord::PostProcessDynamicModuleImport()
    {
        JavascriptPromise *promise = this->GetPromise();
        ScriptContext* scriptContext = GetScriptContext();
        AnalysisAssert(scriptContext != nullptr);
        if (promise == nullptr)
        {
            promise = JavascriptPromise::CreateEnginePromise(scriptContext);
            this->SetPromise(promise);
        }

        if (this->ParentsNotified())
        {
            HRESULT hr = NOERROR;
            if (!WasDeclarationInitialized())
            {
                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, scriptContext, this, false);
                }
                else
                {
                    if (!hadNotifyHostReady && !WasEvaluated())
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n"), this->GetSpecifierSz());
                        LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                        {
                            hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                        });

                        hadNotifyHostReady = true;
                    }
                }
            }

            if (FAILED(hr))
            {
                // Cleanup in case of error.
                this->ReleaseParserResourcesForHierarchy();

                // We cannot just use the buffer in the specifier string - need to make a copy here.
                const char16* moduleName = this->GetSpecifierSz();
                size_t length = wcslen(moduleName);
                char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
                wmemcpy_s(allocatedString, length + 1, moduleName, length);
                allocatedString[length] = _u('\0');

                Js::JavascriptError * error = scriptContext->GetLibrary()->CreateURIError();
                JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext, this);
            }
        }

        return JavascriptPromise::CreatePassThroughPromise(this->promise, scriptContext);
    }